

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O1

void add_to_dam(artifact *art,wchar_t fixed,wchar_t random)

{
  uint32_t uVar1;
  wchar_t wVar2;
  char *fmt;
  
  if (art->to_d < L'\x1b') {
    if (L'\x10' < art->to_h) {
      uVar1 = 2;
      goto LAB_0019a63e;
    }
  }
  else {
    uVar1 = 6;
LAB_0019a63e:
    uVar1 = Rand_div(uVar1);
    if (uVar1 != 0) {
      wVar2 = art->to_d;
      fmt = "Failed to add to-dam, value %d is too high\n";
      goto LAB_0019a67a;
    }
  }
  uVar1 = Rand_div(fixed);
  wVar2 = (int)(short)((short)uVar1 + 1) + art->to_d;
  art->to_d = wVar2;
  fmt = "Adding ability: extra to_dam (now %+d)\n";
LAB_0019a67a:
  file_putf(log_file,fmt,(ulong)(uint)wVar2);
  return;
}

Assistant:

static void add_to_dam(struct artifact *art, int fixed, int random)
{
	/* Inhibit above certain threshholds */
	if (art->to_d > VERYHIGH_TO_DAM) {
		if (!INHIBIT_STRONG) {
			file_putf(log_file, "Failed to add to-dam, value %d is too high\n",
					  art->to_d);
			return;
		}
	} else if (art->to_h > HIGH_TO_DAM) {
		if (!INHIBIT_WEAK) {
			file_putf(log_file, "Failed to add to-dam, value %d is too high\n",
					  art->to_d);
			return;
		}
	}
	art->to_d += (int16_t)(fixed + randint0(random));
	file_putf(log_file, "Adding ability: extra to_dam (now %+d)\n",
			  art->to_d);
}